

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# performance_test_image_function.cpp
# Opt level: O1

pair<double,_double>
Function_Template::template_ConvertToRgb
          (ConvertToRgbForm2 ConvertToRgb,string *namespaceName,uint32_t size)

{
  uint32_t uVar1;
  uint32_t i;
  uint uVar2;
  pair<double,_double> pVar3;
  Image output;
  TimerContainer timer;
  Image input;
  ImageTemplate<unsigned_char> local_a0;
  TimerContainer local_78;
  Image local_58;
  
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate(&local_a0,0,0,'\x01','\x01');
  Test_Helper::uniformImage(&local_58,size,size,&local_a0);
  local_a0._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00201be8;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_a0);
  Test_Helper::uniformRGBImage(&local_a0,size,size);
  SetupFunction(namespaceName);
  Performance_Test::TimerContainer::TimerContainer(&local_78);
  uVar2 = 0;
  while( true ) {
    uVar1 = Test_Helper::runCount();
    if (uVar1 <= uVar2) break;
    Performance_Test::TimerContainer::start(&local_78);
    (*ConvertToRgb)(&local_58,&local_a0);
    Performance_Test::TimerContainer::stop(&local_78);
    uVar2 = uVar2 + 1;
  }
  CleanupFunction(namespaceName);
  pVar3 = Performance_Test::BaseTimerContainer::mean(&local_78.super_BaseTimerContainer);
  Performance_Test::TimerContainer::~TimerContainer(&local_78);
  local_a0._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00201be8;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_a0);
  local_58._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00201be8;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_58);
  return pVar3;
}

Assistant:

std::pair < double, double > template_ConvertToRgb( ConvertToRgbForm2 ConvertToRgb, const std::string & namespaceName, uint32_t size )
    {
        PenguinV_Image::Image input  = Performance_Test::uniformImage   ( size, size );
        PenguinV_Image::Image output = Performance_Test::uniformRGBImage( size, size );

        TEST_FUNCTION_LOOP( ConvertToRgb( input, output ), namespaceName )
    }